

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::anon_unknown_23::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  undefined8 in_RAX;
  undefined **ppuVar1;
  long *plVar2;
  ostream *poVar3;
  size_t sVar4;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x20);
    ppuVar1 = &PTR__Context_001bac90;
    *IMutableContext::currentContext = &PTR__Context_001bac90;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
  }
  else {
    ppuVar1 = (undefined **)*IMutableContext::currentContext;
  }
  plVar2 = (long *)(*(code *)ppuVar1[4])();
  poVar3 = (ostream *)(**(code **)(*plVar2 + 0x18))(plVar2);
  uStack_18 = CONCAT17(0x1b,(undefined7)uStack_18);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)((long)&uStack_18 + 7),1);
  if (this == (PosixColourImpl *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)this,sVar4);
  }
  std::ostream::flush();
  return;
}

Assistant:

void setColour(const char *_escapeCode) {
                // The escape sequence must be flushed to console, otherwise if
                // stdin and stderr are intermixed, we'd get accidentally coloured output.
                getCurrentContext().getConfig()->stream()
                    << '\033' << _escapeCode << std::flush;
            }